

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  bool bVar1;
  bool b;
  size_type sVar2;
  const_iterator pbVar3;
  uint local_80;
  uint i;
  uint local_6c;
  size_type local_68;
  Fault local_60;
  Fault f;
  size_type local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  initializer_list<bool> expected_local;
  
  _kjCondition._32_8_ = expected._M_array;
  local_50 = std::initializer_list<bool>::size((initializer_list<bool> *)&_kjCondition.result);
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  f.exception._4_4_ = List<bool,_(capnp::Kind)0>::Builder::size(&reader);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_int> *)local_40,&local_48,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    local_68 = std::initializer_list<bool>::size((initializer_list<bool> *)&_kjCondition.result);
    local_6c = List<bool,_(capnp::Kind)0>::Builder::size(&reader);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x89,FAILED,"(expected.size()) == (reader.size())",
               "_kjCondition,expected.size(), reader.size()",
               (DebugComparison<unsigned_long,_unsigned_int> *)local_40,&local_68,&local_6c);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  local_80 = 0;
  while( true ) {
    sVar2 = std::initializer_list<bool>::size((initializer_list<bool> *)&_kjCondition.result);
    if (sVar2 <= local_80) break;
    pbVar3 = std::initializer_list<bool>::begin((initializer_list<bool> *)&_kjCondition.result);
    bVar1 = pbVar3[local_80];
    b = List<bool,_(capnp::Kind)0>::Builder::operator[](&reader,local_80);
    checkElement<bool>((bool)(bVar1 & 1),b);
    local_80 = local_80 + 1;
  }
  return;
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}